

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O1

QDebug * operator<<(QDebug *s,QVectorPath *path)

{
  Stream *pSVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QDebugStateSaver saver;
  QRectF local_70;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_48,(QDebug *)s);
  local_70.h._0_4_ = 0xffffffff;
  local_70.h._4_4_ = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_70.yp._0_4_ = 0xffffffff;
  local_70.yp._4_4_ = 0xffffffff;
  local_70.w._0_4_ = 0xffffffff;
  local_70.w._4_4_ = 0xffffffff;
  QVectorPath::controlPointRect(path);
  pSVar1 = s->stream;
  QVar2.m_data = (storage_type *)0x11;
  QVar2.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(&pSVar1->ts,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (s->stream->space == true) {
    QTextStream::operator<<(&s->stream->ts,' ');
  }
  QTextStream::operator<<(&s->stream->ts,path->m_count);
  if (s->stream->space == true) {
    QTextStream::operator<<(&s->stream->ts,' ');
  }
  pSVar1 = s->stream;
  QVar3.m_data = (storage_type *)0x7;
  QVar3.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(&pSVar1->ts,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (s->stream->space == true) {
    QTextStream::operator<<(&s->stream->ts,' ');
  }
  Qt::hex(&s->stream->ts);
  QTextStream::operator<<(&s->stream->ts,path->m_hints);
  if (s->stream->space == true) {
    QTextStream::operator<<(&s->stream->ts,' ');
  }
  local_70.xp = (qreal)s->stream;
  ((Stream *)local_70.xp)->ref = ((Stream *)local_70.xp)->ref + 1;
  operator<<((QDebug *)&local_40,&local_70);
  QTextStream::operator<<((QTextStream *)local_40.d.d,')');
  if ((char)local_40.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
  {
    QTextStream::operator<<((QTextStream *)local_40.d.d,' ');
  }
  QDebug::~QDebug((QDebug *)&local_40);
  QDebug::~QDebug((QDebug *)&local_70);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDebug Q_GUI_EXPORT &operator<<(QDebug &s, const QVectorPath &path)
{
    QDebugStateSaver saver(s);
    QRectF rf = path.controlPointRect();
    s << "QVectorPath(size:" << path.elementCount()
      << " hints:" << Qt::hex << path.hints()
      << rf << ')';
    return s;
}